

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_geometry(Impl *this)

{
  char *pcVar1;
  MetadataKind MVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint value1;
  uint uVar6;
  Builder *this_00;
  MDNode *node;
  Function *entryPoint;
  void *pvVar7;
  LoggingCallback p_Var8;
  ExecutionMode mode;
  char buffer [4096];
  Capability local_1038 [3];
  undefined3 uStack_102b;
  undefined5 uStack_1028;
  char acStack_1023 [4083];
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  local_1038[0] = 2;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&this_00->capabilities,local_1038);
  node = (MDNode *)get_shader_property_tag(this->entry_point_meta,GSState);
  if (node != (MDNode *)0x0) {
    MVar2 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)node);
    if (MVar2 != Node) {
      p_Var8 = get_thread_log_callback();
      if (p_Var8 == (LoggingCallback)0x0) {
        emit_execution_modes_geometry();
        std::terminate();
      }
      uStack_1028 = 0x6163206e69;
      builtin_strncpy(acStack_1023,"st<T>.\n",8);
      local_1038._0_8_ = 0x2064696c61766e49;
      stack0xffffffffffffefd0 = 0x2065707974;
      uStack_102b = 0x204449;
      pvVar7 = get_thread_log_callback_userdata();
      (*p_Var8)(pvVar7,Error,(char *)local_1038);
      std::terminate();
    }
    uVar3 = get_constant_metadata<unsigned_int>(node,0);
    uVar4 = get_constant_metadata<unsigned_int>(node,1);
    entryPoint = SPIRVModule::get_entry_function(this->spirv_module);
    uVar5 = get_constant_metadata<unsigned_int>(node,3);
    value1 = get_constant_metadata<unsigned_int>(node,4);
    uVar6 = get_constant_metadata<unsigned_int>(node,2);
    (this->execution_mode_meta).gs_stream_active_mask = uVar6;
    spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeInvocations,value1,-1,-1);
    spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeOutputVertices,uVar4,-1,-1);
    uVar4 = uVar3 - 1;
    if (((byte)uVar4 < 7) && ((0x67U >> (uVar4 & 0x1f) & 1) != 0)) {
      uVar3 = (uVar4 & 0xff) << 2;
      uVar4 = *(uint *)(&DAT_001c2678 + uVar3);
      spv::Builder::addExecutionMode
                (this_00,entryPoint,*(ExecutionMode *)(&DAT_001c265c + uVar3),-1,-1,-1);
      (this->execution_mode_meta).stage_input_num_vertex = uVar4;
      if ((char)uVar5 == '\x05') {
        mode = ExecutionModeOutputTriangleStrip;
      }
      else if ((uVar5 & 0xff) == 3) {
        mode = ExecutionModeOutputLineStrip;
      }
      else {
        if ((uVar5 & 0xff) != 1) {
          p_Var8 = get_thread_log_callback();
          if (p_Var8 == (LoggingCallback)0x0) {
            emit_execution_modes_geometry((Impl *)(ulong)(uVar5 & 0xff));
            return false;
          }
          pcVar1 = "[ERROR]: Unexpected output primitive topology (%u).\n";
          goto LAB_00124194;
        }
        mode = ExecutionModeOutputPoints;
      }
      spv::Builder::addExecutionMode(this_00,entryPoint,mode,-1,-1,-1);
      return true;
    }
    p_Var8 = get_thread_log_callback();
    if (p_Var8 != (LoggingCallback)0x0) {
      pcVar1 = "[ERROR]: Unexpected input primitive (%u).\n";
LAB_00124194:
      snprintf((char *)local_1038,0x1000,pcVar1 + 9);
      pvVar7 = get_thread_log_callback_userdata();
      (*p_Var8)(pvVar7,Error,(char *)local_1038);
      return false;
    }
    emit_execution_modes_geometry((Impl *)(ulong)(uVar3 & 0xff));
  }
  return false;
}

Assistant:

bool Converter::Impl::emit_execution_modes_geometry()
{
	auto &builder = spirv_module.get_builder();
	builder.addCapability(spv::CapabilityGeometry);
	auto *gs_state_node = get_shader_property_tag(entry_point_meta, DXIL::ShaderPropertyTag::GSState);

	if (gs_state_node)
	{
		auto *arguments = llvm::cast<llvm::MDNode>(*gs_state_node);

		auto input_primitive = static_cast<DXIL::InputPrimitive>(get_constant_metadata(arguments, 0));
		unsigned max_vertex_count = get_constant_metadata(arguments, 1);

		auto *func = spirv_module.get_entry_function();

		auto topology = static_cast<DXIL::PrimitiveTopology>(get_constant_metadata(arguments, 3));
		unsigned gs_instances = get_constant_metadata(arguments, 4);

		execution_mode_meta.gs_stream_active_mask = get_constant_metadata(arguments, 2);

		builder.addExecutionMode(func, spv::ExecutionModeInvocations, gs_instances);
		builder.addExecutionMode(func, spv::ExecutionModeOutputVertices, max_vertex_count);

		switch (input_primitive)
		{
		case DXIL::InputPrimitive::Point:
			builder.addExecutionMode(func, spv::ExecutionModeInputPoints);
			execution_mode_meta.stage_input_num_vertex = 1;
			break;

		case DXIL::InputPrimitive::Line:
			builder.addExecutionMode(func, spv::ExecutionModeInputLines);
			execution_mode_meta.stage_input_num_vertex = 2;
			break;

		case DXIL::InputPrimitive::LineWithAdjacency:
			builder.addExecutionMode(func, spv::ExecutionModeInputLinesAdjacency);
			execution_mode_meta.stage_input_num_vertex = 4;
			break;

		case DXIL::InputPrimitive::Triangle:
			builder.addExecutionMode(func, spv::ExecutionModeTriangles);
			execution_mode_meta.stage_input_num_vertex = 3;
			break;

		case DXIL::InputPrimitive::TriangleWithAdjaceny:
			builder.addExecutionMode(func, spv::ExecutionModeInputTrianglesAdjacency);
			execution_mode_meta.stage_input_num_vertex = 6;
			break;

		default:
			LOGE("Unexpected input primitive (%u).\n", unsigned(input_primitive));
			return false;
		}

		switch (topology)
		{
		case DXIL::PrimitiveTopology::PointList:
			builder.addExecutionMode(func, spv::ExecutionModeOutputPoints);
			break;

		case DXIL::PrimitiveTopology::LineStrip:
			builder.addExecutionMode(func, spv::ExecutionModeOutputLineStrip);
			break;

		case DXIL::PrimitiveTopology::TriangleStrip:
			builder.addExecutionMode(func, spv::ExecutionModeOutputTriangleStrip);
			break;

		default:
			LOGE("Unexpected output primitive topology (%u).\n", unsigned(topology));
			return false;
		}
		return true;
	}
	else
		return false;
}